

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O3

char * __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  size_t __n;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  PointerType pBVar4;
  char *pcVar5;
  PointerType pBVar6;
  pointer __s;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  pointer this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  _Alloc_hider _Var9;
  cmStateSnapshot parent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  child_dirs;
  allocator local_91;
  undefined1 local_90 [16];
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  cmState *local_38;
  
  if (GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') {
    GetProperty();
  }
  std::__cxx11::string::_M_replace
            (0x6fb6f0,0,
             (char *)GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.
                     _M_string_length,0x5ebb3a);
  iVar3 = std::__cxx11::string::compare((char *)prop);
  if (iVar3 == 0) {
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)&local_68,&this->Snapshot_);
    bVar2 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_68);
    if (!bVar2) {
      return "";
    }
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_90,(cmStateSnapshot *)&local_68);
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       ((iterator *)local_90);
    return (pBVar4->Location)._M_dataplus._M_p;
  }
  __n = prop->_M_string_length;
  if ((__n == kBINARY_DIR_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,kBINARY_DIR_abi_cxx11_._M_dataplus._M_p,__n),
      iVar3 == 0)))) {
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    __s = (pBVar4->OutputLocation)._M_dataplus._M_p;
  }
  else {
    if ((__n != kSOURCE_DIR_abi_cxx11_._M_string_length) ||
       ((__n != 0 &&
        (iVar3 = bcmp((prop->_M_dataplus)._M_p,kSOURCE_DIR_abi_cxx11_._M_dataplus._M_p,__n),
        iVar3 != 0)))) {
      if ((__n == kSUBDIRECTORIES_abi_cxx11_._M_string_length) &&
         ((__n == 0 ||
          (iVar3 = bcmp((prop->_M_dataplus)._M_p,kSUBDIRECTORIES_abi_cxx11_._M_dataplus._M_p,__n),
          iVar3 == 0)))) {
        local_48._M_allocated_capacity = 0;
        local_48._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
        local_38 = (cmState *)0x0;
        pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           (&this->DirectoryState);
        this_01 = (pBVar4->Children).
                  super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (this_01 !=
            (pBVar4->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            cmStateSnapshot::GetDirectory((cmStateDirectory *)local_90,this_01);
            pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->((iterator *)local_90);
            std::__cxx11::string::string
                      ((string *)local_68._M_local_buf,(pBVar6->Location)._M_dataplus._M_p,&local_91
                      );
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_48._M_local_buf,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_allocated_capacity != &local_58) {
              operator_delete((void *)local_68._M_allocated_capacity,
                              local_58._M_allocated_capacity + 1);
            }
            this_01 = this_01 + 1;
          } while (this_01 !=
                   (pBVar4->Children).
                   super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)local_90,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_48,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)local_90);
        if ((cmState *)local_90._0_8_ != (cmState *)local_80) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
        }
        this_00 = &local_48;
        _Var9._M_p = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus.
                     _M_p;
      }
      else {
        if ((__n == kBUILDSYSTEM_TARGETS_abi_cxx11_._M_string_length) &&
           ((__n == 0 ||
            (iVar3 = bcmp((prop->_M_dataplus)._M_p,kBUILDSYSTEM_TARGETS_abi_cxx11_._M_dataplus._M_p,
                          __n), iVar3 == 0)))) {
          pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&this->DirectoryState);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_90,&pBVar4->NormalTargetNames,";");
LAB_00309c27:
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)local_90);
          if ((cmState *)local_90._0_8_ == (cmState *)local_80) {
            return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p
            ;
          }
          operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
          return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
        }
        iVar3 = std::__cxx11::string::compare((char *)prop);
        if (iVar3 == 0) {
          local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )ZEXT816(0);
          local_58._M_allocated_capacity = 0;
          local_38 = (cmState *)(this->Snapshot_).Position.Position;
          local_48._M_allocated_capacity = (size_type)(this->Snapshot_).State;
          local_48._8_8_ = (this->Snapshot_).Position.Tree;
          while (bVar2 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_48), bVar2) {
            cmStateSnapshot::GetExecutionListFile_abi_cxx11_
                      ((string *)local_90,(cmStateSnapshot *)&local_48);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_68._M_local_buf,(string *)local_90);
            if ((cmState *)local_90._0_8_ != (cmState *)local_80) {
              operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
            }
            cmStateSnapshot::GetCallStackParent
                      ((cmStateSnapshot *)local_90,(cmStateSnapshot *)&local_48);
            local_38 = (cmState *)local_80._0_8_;
            local_48._M_allocated_capacity = local_90._0_8_;
            local_48._8_8_ = local_90._8_8_;
          }
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_68._8_8_ + -0x20);
          uVar7 = local_68._M_allocated_capacity;
          if (local_68._M_allocated_capacity < pbVar8 &&
              local_68._M_allocated_capacity != local_68._8_8_) {
            do {
              std::__cxx11::string::swap((string *)uVar7);
              uVar7 = uVar7 + 0x20;
              pbVar8 = pbVar8 + -1;
            } while ((ulong)uVar7 < pbVar8);
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_90,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_68,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)local_90);
          _Var9 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
          if ((cmState *)local_90._0_8_ != (cmState *)local_80) {
            operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
            _Var9 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)prop);
          if (iVar3 == 0) {
            cmState::GetCacheEntryKeys_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_68,(this->Snapshot_).State);
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)local_90,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_68,";");
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                       (string *)local_90);
            if ((cmState *)local_90._0_8_ != (cmState *)local_80) {
              operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_68);
            return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p
            ;
          }
          iVar3 = std::__cxx11::string::compare((char *)prop);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)prop);
            if (iVar3 == 0) {
              local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          )GetIncludeDirectoriesEntries_abi_cxx11_(this);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)prop);
              if (iVar3 == 0) {
                local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            )GetCompileOptionsEntries_abi_cxx11_(this);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)prop);
                if (iVar3 != 0) {
                  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                           operator->(&this->DirectoryState);
                  pcVar5 = cmPropertyMap::GetPropertyValue(&pBVar4->Properties,prop);
                  if (!chain || pcVar5 != (char *)0x0) {
                    return pcVar5;
                  }
                  cmStateSnapshot::GetBuildsystemDirectoryParent
                            ((cmStateSnapshot *)&local_68,&this->Snapshot_);
                  bVar2 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_68);
                  if (bVar2) {
                    cmStateSnapshot::GetDirectory
                              ((cmStateDirectory *)local_90,(cmStateSnapshot *)&local_68);
                    pcVar5 = GetProperty((cmStateDirectory *)local_90,prop,true);
                    return pcVar5;
                  }
                  pcVar5 = cmState::GetGlobalProperty((this->Snapshot_).State,prop);
                  return pcVar5;
                }
                local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            )GetCompileDefinitionsEntries_abi_cxx11_(this);
              }
            }
            cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                      ((string *)local_90,
                       (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&local_68,";");
            goto LAB_00309c27;
          }
          cmStateSnapshot::ClosureKeys_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_68,&this->Snapshot_);
          cmState::GetCacheEntryKeys_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,(this->Snapshot_).State);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                     local_68._8_8_,local_48._M_allocated_capacity,local_48._8_8_);
          std::
          sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_68._M_allocated_capacity,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_68._8_8_);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_90,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_68,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)local_90);
          if ((cmState *)local_90._0_8_ != (cmState *)local_80) {
            operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
          }
          _Var9._M_p = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus.
                       _M_p;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_48);
        }
        this_00 = &local_68;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
      return _Var9._M_p;
    }
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    __s = (pBVar4->Location)._M_dataplus._M_p;
  }
  sVar1 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace(0x6fb6f0,0,(char *)sVar1,(ulong)__s);
  return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
}

Assistant:

const char* cmStateDirectory::GetProperty(const std::string& prop,
                                          bool chain) const
{
  static std::string output;
  output = "";
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return parent.GetDirectory().GetCurrentSource();
    }
    return "";
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return output.c_str();
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return output.c_str();
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    for (std::vector<cmStateSnapshot>::const_iterator ci = children.begin();
         ci != children.end(); ++ci) {
      child_dirs.push_back(ci->GetDirectory().GetCurrentSource());
    }
    output = cmJoin(child_dirs, ";");
    return output.c_str();
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmJoin(this->DirectoryState->NormalTargetNames, ";");
    return output.c_str();
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return output.c_str();
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return output.c_str();
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    std::vector<std::string> cacheKeys =
      this->Snapshot_.State->GetCacheEntryKeys();
    res.insert(res.end(), cacheKeys.begin(), cacheKeys.end());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return output.c_str();
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return output.c_str();
  }

  const char* retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}